

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall
ColorPrimariesBT601_625_EBU::ColorPrimariesBT601_625_EBU(ColorPrimariesBT601_625_EBU *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  ColorPrimaryTransform *in_RDI;
  ColorPrimaryTransform *inToXYZ;
  ColorPrimaries *in_stack_fffffffffffffee0;
  allocator_type *in_stack_fffffffffffffef8;
  allocator_type *__a;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff00;
  vector<float,_std::allocator<float>_> *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar1;
  undefined1 in_stack_ffffffffffffff0c [12];
  undefined1 local_89 [49];
  undefined1 *local_58;
  undefined8 local_50;
  
  local_89._17_8_ = 0x3d921b3b3f34e758;
  local_89._25_8_ = 0x3e04a98b3ca554b9;
  local_89._1_8_ = 0x3eaedfa43edc7193;
  local_89._9_8_ = 0x3e6355043e36a1e8;
  local_89._33_4_ = 0x3f707768;
  local_58 = local_89 + 1;
  local_50 = 9;
  inToXYZ = (ColorPrimaryTransform *)local_89;
  std::allocator<float>::allocator((allocator<float> *)0x128103);
  __l._4_12_ = in_stack_ffffffffffffff0c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff08;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,__l,in_stack_fffffffffffffef8);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  __a = (allocator_type *)0x3d2a35933ff01fb8;
  this_00 = (vector<float,_std::allocator<float>_> *)0xbe6a4a493d8afab5;
  uVar1 = 0x3f88d7f1;
  std::allocator<float>::allocator((allocator<float> *)0x12817f);
  __l_00._4_12_ = in_stack_ffffffffffffff0c;
  __l_00._M_array._0_4_ = uVar1;
  std::vector<float,_std::allocator<float>_>::vector(this_00,__l_00,__a);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  ColorPrimaries::ColorPrimaries(in_stack_fffffffffffffee0,inToXYZ,in_RDI);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x1281d5);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x1281ef);
  return;
}

Assistant:

ColorPrimariesBT601_625_EBU() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.430554f, +0.341550f, +0.178352f,
            +0.222004f, +0.706655f, +0.071341f,
            +0.020182f, +0.129553f, +0.939322f
        }),
        ColorPrimaryTransform({
            +3.063361f, -1.393390f, -0.475824f,
            -0.969244f, +1.875968f, +0.041555f,
            +0.067861f, -0.228799f, +1.069090f
        })
    ) {}